

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Rattle.cpp
# Opt level: O1

int __thiscall OpenMD::Rattle::constraintPairB(Rattle *this,ConstraintPair *consPair)

{
  double *pdVar1;
  ConstraintElem *pCVar2;
  ConstraintElem *pCVar3;
  StuntDouble *pSVar4;
  StuntDouble *pSVar5;
  uint i;
  int iVar6;
  long lVar7;
  double tmp_1;
  double tmp;
  double dVar8;
  undefined1 auVar9 [16];
  double dVar10;
  Vector<double,_3U> result_1;
  Vector<double,_3U> result_2;
  Vector<double,_3U> result_6;
  Vector<double,_3U> result;
  double local_138 [4];
  double local_118 [4];
  double local_f8 [4];
  double local_d8 [4];
  double local_b8 [4];
  Vector3d local_98;
  double local_78 [4];
  double local_58 [4];
  double local_38 [3];
  
  pCVar2 = consPair->consElem1_;
  pCVar3 = consPair->consElem2_;
  pSVar4 = pCVar2->sd_;
  lVar7 = *(long *)((long)&(pSVar4->snapshotMan_->currentSnapshot_->atomData).velocity.
                           super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                           ._M_impl.super__Vector_impl_data + pSVar4->storage_);
  local_f8[2] = (double)*(undefined8 *)(lVar7 + 0x10 + (long)pSVar4->localIndex_ * 0x18);
  pdVar1 = (double *)(lVar7 + (long)pSVar4->localIndex_ * 0x18);
  local_f8[0] = *pdVar1;
  local_f8[1] = pdVar1[1];
  pSVar4 = pCVar3->sd_;
  lVar7 = *(long *)((long)&(pSVar4->snapshotMan_->currentSnapshot_->atomData).velocity.
                           super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + pSVar4->storage_);
  local_118[2] = (double)*(undefined8 *)(lVar7 + 0x10 + (long)pSVar4->localIndex_ * 0x18);
  pdVar1 = (double *)(lVar7 + (long)pSVar4->localIndex_ * 0x18);
  local_118[0] = *pdVar1;
  local_118[1] = pdVar1[1];
  local_78[0] = 0.0;
  local_78[1] = 0.0;
  local_78[2] = 0.0;
  lVar7 = 0;
  do {
    local_78[lVar7] = local_f8[lVar7] - local_118[lVar7];
    lVar7 = lVar7 + 1;
  } while (lVar7 != 3);
  pSVar4 = pCVar2->sd_;
  lVar7 = *(long *)((long)&(pSVar4->snapshotMan_->currentSnapshot_->atomData).position.
                           super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                           ._M_impl.super__Vector_impl_data + pSVar4->storage_);
  local_38[2] = (double)*(undefined8 *)(lVar7 + 0x10 + (long)pSVar4->localIndex_ * 0x18);
  pdVar1 = (double *)(lVar7 + (long)pSVar4->localIndex_ * 0x18);
  local_38[0] = *pdVar1;
  local_38[1] = pdVar1[1];
  pSVar4 = pCVar3->sd_;
  lVar7 = *(long *)((long)&(pSVar4->snapshotMan_->currentSnapshot_->atomData).position.
                           super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + pSVar4->storage_);
  local_58[2] = (double)*(undefined8 *)(lVar7 + 0x10 + (long)pSVar4->localIndex_ * 0x18);
  pdVar1 = (double *)(lVar7 + (long)pSVar4->localIndex_ * 0x18);
  local_58[0] = *pdVar1;
  local_58[1] = pdVar1[1];
  local_138[0] = 0.0;
  local_138[1] = 0.0;
  local_138[2] = 0.0;
  lVar7 = 0;
  do {
    local_138[lVar7] = local_38[lVar7] - local_58[lVar7];
    lVar7 = lVar7 + 1;
  } while (lVar7 != 3);
  local_98.super_Vector<double,_3U>.data_[2] = local_138[2];
  local_98.super_Vector<double,_3U>.data_[0] = local_138[0];
  local_98.super_Vector<double,_3U>.data_[1] = local_138[1];
  Snapshot::wrapVector(this->currentSnapshot_,&local_98);
  pSVar4 = pCVar2->sd_;
  pSVar5 = pCVar3->sd_;
  dVar8 = 0.0;
  lVar7 = 0;
  do {
    dVar8 = dVar8 + local_98.super_Vector<double,_3U>.data_[lVar7] * local_78[lVar7];
    lVar7 = lVar7 + 1;
  } while (lVar7 != 3);
  auVar9._8_8_ = pSVar5->mass_;
  auVar9._0_8_ = pSVar4->mass_;
  auVar9 = divpd(_DAT_0029ca60,auVar9);
  dVar8 = -dVar8 / ((auVar9._0_8_ + auVar9._8_8_) * consPair->dist2);
  dVar10 = ABS(dVar8);
  iVar6 = 1;
  if (this->consTolerance_ <= dVar10 && dVar10 != this->consTolerance_) {
    local_d8[0] = 0.0;
    local_d8[1] = 0.0;
    local_d8[2] = 0.0;
    lVar7 = 0;
    do {
      local_d8[lVar7] = local_98.super_Vector<double,_3U>.data_[lVar7] * dVar8;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 3);
    local_138[0] = 0.0;
    local_138[1] = 0.0;
    local_138[2] = 0.0;
    lVar7 = 0;
    do {
      local_138[lVar7] = local_d8[lVar7] * auVar9._0_8_;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 3);
    lVar7 = 0;
    do {
      local_f8[lVar7] = local_138[lVar7] + local_f8[lVar7];
      lVar7 = lVar7 + 1;
    } while (lVar7 != 3);
    iVar6 = pSVar4->localIndex_;
    lVar7 = *(long *)((long)&(pSVar4->snapshotMan_->currentSnapshot_->atomData).velocity.
                             super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                             ._M_impl.super__Vector_impl_data + pSVar4->storage_);
    *(double *)(lVar7 + 0x10 + (long)iVar6 * 0x18) = local_f8[2];
    pdVar1 = (double *)(lVar7 + (long)iVar6 * 0x18);
    *pdVar1 = local_f8[0];
    pdVar1[1] = local_f8[1];
    local_138[0] = 0.0;
    local_138[1] = 0.0;
    local_138[2] = 0.0;
    lVar7 = 0;
    do {
      local_138[lVar7] = local_d8[lVar7] * auVar9._8_8_;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 3);
    lVar7 = 0;
    do {
      local_118[lVar7] = local_118[lVar7] - local_138[lVar7];
      lVar7 = lVar7 + 1;
    } while (lVar7 != 3);
    iVar6 = pSVar5->localIndex_;
    lVar7 = *(long *)((long)&(pSVar5->snapshotMan_->currentSnapshot_->atomData).velocity.
                             super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + pSVar5->storage_);
    *(double *)(lVar7 + 0x10 + (long)iVar6 * 0x18) = local_118[2];
    pdVar1 = (double *)(lVar7 + (long)iVar6 * 0x18);
    *pdVar1 = local_118[0];
    pdVar1[1] = local_118[1];
    local_138[0] = 0.0;
    local_138[1] = 0.0;
    local_138[2] = 0.0;
    lVar7 = 0;
    do {
      local_138[lVar7] = local_d8[lVar7] + local_d8[lVar7];
      lVar7 = lVar7 + 1;
    } while (lVar7 != 3);
    dVar8 = this->dt_;
    local_b8[0] = 0.0;
    local_b8[1] = 0.0;
    local_b8[2] = 0.0;
    lVar7 = 0;
    do {
      local_b8[lVar7] = local_138[lVar7] / dVar8;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 3);
    dVar8 = 0.0;
    lVar7 = 0;
    do {
      dVar8 = dVar8 + local_b8[lVar7] * local_b8[lVar7];
      lVar7 = lVar7 + 1;
    } while (lVar7 != 3);
    if (dVar8 < 0.0) {
      dVar8 = sqrt(dVar8);
    }
    else {
      dVar8 = SQRT(dVar8);
    }
    dVar10 = 0.0;
    lVar7 = 0;
    do {
      dVar10 = dVar10 + local_b8[lVar7] * local_98.super_Vector<double,_3U>.data_[lVar7];
      lVar7 = lVar7 + 1;
    } while (lVar7 != 3);
    consPair->force_ =
         (double)((ulong)ABS(dVar8) | (ulong)dVar10 & 0x8000000000000000) + consPair->force_;
    iVar6 = 0;
  }
  return iVar6;
}

Assistant:

int Rattle::constraintPairB(ConstraintPair* consPair) {
    ConstraintElem* consElem1 = consPair->getConsElem1();
    ConstraintElem* consElem2 = consPair->getConsElem2();

    Vector3d velA = consElem1->getVel();
    Vector3d velB = consElem2->getVel();

    Vector3d dv = velA - velB;

    Vector3d posA = consElem1->getPos();
    Vector3d posB = consElem2->getPos();

    Vector3d rab = posA - posB;

    currentSnapshot_->wrapVector(rab);

    RealType rma = 1.0 / consElem1->getMass();
    RealType rmb = 1.0 / consElem2->getMass();

    RealType rvab = dot(rab, dv);

    RealType gab = -rvab / ((rma + rmb) * consPair->getConsDistSquare());

    if (fabs(gab) > consTolerance_) {
      Vector3d delta = rab * gab;
      velA += rma * delta;
      consElem1->setVel(velA);

      velB -= rmb * delta;
      consElem2->setVel(velB);

      // report the constraint force back to the constraint pair:

      Vector3d fcons = 2.0 * delta / dt_;
      RealType proj  = copysign(fcons.length(), dot(fcons, rab));

      consPair->addConstraintForce(proj);
      return consSuccess;
    } else {
      return consAlready;
    }
  }